

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMimeGlobPattern>::reallocateAndGrow
          (QArrayDataPointer<QMimeGlobPattern> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMimeGlobPattern> *old)

{
  long lVar1;
  bool bVar2;
  QMimeGlobPattern *pQVar3;
  QGenericArrayOps<QMimeGlobPattern> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QMimeGlobPattern> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QMimeGlobPattern> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QMimeGlobPattern *in_stack_ffffffffffffff70;
  QMimeGlobPattern *in_stack_ffffffffffffff78;
  QGenericArrayOps<QMimeGlobPattern> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QMimeGlobPattern> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QMimeGlobPattern> *)in_stack_ffffffffffffff70), bVar2)
      ) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QMimeGlobPattern> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI
                );
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QMimeGlobPattern> *)&stack0xffffffffffffffe0),
       pQVar3 == (QMimeGlobPattern *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_008f13aa;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QMimeGlobPattern> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QMimeGlobPattern> *)
                  operator->((QArrayDataPointer<QMimeGlobPattern> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QMimeGlobPattern> *)0x8f12b7);
        begin((QArrayDataPointer<QMimeGlobPattern> *)0x8f12c6);
        QtPrivate::QGenericArrayOps<QMimeGlobPattern>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QMimeGlobPattern *)
             operator->((QArrayDataPointer<QMimeGlobPattern> *)&stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QMimeGlobPattern> *)0x8f1301);
        begin((QArrayDataPointer<QMimeGlobPattern> *)0x8f1310);
        QtPrivate::QGenericArrayOps<QMimeGlobPattern>::moveAppend
                  (in_stack_ffffffffffffff80,pQVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QMimeGlobPattern> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<QMimeGlobPattern> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QMimeGlobPattern> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<QMimeGlobPattern> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QMimeGlobPattern> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QMimeGlobPattern> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QMimeGlobPattern> *)in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QMimeGlobPattern>::reallocate
              ((QMovableArrayOps<QMimeGlobPattern> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_008f13aa:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }